

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int hashFunction(string *word)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int i;
  ulong uVar4;
  double dVar5;
  
  uVar3 = 0;
  iVar2 = 0;
  for (uVar4 = 0; uVar4 < word->_M_string_length; uVar4 = uVar4 + 1) {
    cVar1 = (word->_M_dataplus)._M_p[uVar4];
    dVar5 = exp2((double)uVar3);
    iVar2 = (int)(dVar5 * (double)(int)cVar1 + (double)iVar2);
    uVar3 = uVar3 + 2;
  }
  return iVar2;
}

Assistant:

int hashFunction(string word) {
    int result = 0;
    for (int i = 0; i < word.size(); ++i) {
        result += word[i] * pow(4, i);
    }
    return result;
}